

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::CommandLineInterface::Run
          (CommandLineInterface *this,int argc,char **argv)

{
  ErrorFormat EVar1;
  pointer pbVar2;
  GeneratorContextImpl *pGVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  _Rb_tree_header *p_Var6;
  pointer puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  ParseArgumentStatus PVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  SimpleDescriptorDatabase *this_00;
  Type *pTVar17;
  ostream *poVar18;
  char *pcVar19;
  size_t sVar20;
  MergedDescriptorDatabase *this_01;
  DescriptorPool *pDVar21;
  LogMessage *pLVar22;
  pointer pOVar23;
  mapped_type *pmVar24;
  GeneratorContextImpl *pGVar25;
  DescriptorProto *pDVar26;
  FileDescriptor *pFVar27;
  pointer ppFVar28;
  ulong uVar29;
  pointer ppFVar30;
  DiskSourceTree *extraout_RDX;
  DiskSourceTree *extraout_RDX_00;
  DiskSourceTree *source_tree;
  undefined8 *puVar31;
  unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
  *db;
  pointer puVar32;
  long lVar33;
  long lVar34;
  __node_base _Var35;
  ulong uVar36;
  pointer pbVar37;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  databases_per_descriptor_set;
  GeneratorContextMap output_directories;
  vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
  raw_databases_per_descriptor_set;
  FileDescriptorSet file_descriptor_set;
  MultiFileErrorCollector *local_258;
  SourceTreeDescriptorDatabase *local_250;
  DiskSourceTree *local_240;
  LogFinisher local_231;
  DescriptorPool *local_230;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_228;
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  local_208;
  string *local_1e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [10];
  ArenaStringPtr local_f8 [6];
  undefined1 local_c8 [24];
  int local_b0;
  LogMessage local_68;
  
  Clear(this);
  PVar13 = ParseArguments(this,argc,argv);
  if (PVar13 == PARSE_ARGUMENT_DONE_AND_EXIT) {
    return 0;
  }
  if (PVar13 == PARSE_ARGUMENT_FAIL) {
    return 1;
  }
  local_228.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_01 = (MergedDescriptorDatabase *)0x0;
  local_228.
  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230 = (DescriptorPool *)0x0;
  local_208.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar37 = (this->descriptor_set_in_names_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->descriptor_set_in_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar37 != pbVar2) {
LAB_0022e11f:
    do {
      iVar14 = open((pbVar37->_M_dataplus)._M_p,0);
      if (iVar14 < 0) goto code_r0x0022e131;
      FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_c8,(Arena *)0x0,false);
      bVar12 = MessageLite::ParseFromFileDescriptor((MessageLite *)local_c8,iVar14);
      iVar14 = close(iVar14);
      if (iVar14 == 0) {
        if (!bVar12) {
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(pbVar37->_M_dataplus)._M_p,
                               pbVar37->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,": Unable to parse.",0x12);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
          std::ostream::put((char)poVar18);
          std::ostream::flush();
          goto LAB_0022e300;
        }
        this_00 = (SimpleDescriptorDatabase *)operator_new(0xb0);
        SimpleDescriptorDatabase::SimpleDescriptorDatabase(this_00);
        if (0 < local_b0) {
          iVar14 = 0;
          do {
            FileDescriptorProto::FileDescriptorProto
                      ((FileDescriptorProto *)local_1a8,(Arena *)0x0,false);
            pTVar17 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                                ((RepeatedPtrFieldBase *)(local_c8 + 0x10),iVar14);
            iVar15 = (*(this_00->super_DescriptorDatabase)._vptr_DescriptorDatabase[2])
                               (this_00,(ulong)(pTVar17->name_).tagged_ptr_.ptr_ &
                                        0xfffffffffffffffe,(FileDescriptorProto *)local_1a8);
            if ((char)iVar15 == '\0') {
              pTVar17 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<google::protobuf::FileDescriptorProto>::TypeHandler>
                                  ((RepeatedPtrFieldBase *)(local_c8 + 0x10),iVar14);
              bVar12 = SimpleDescriptorDatabase::Add(this_00,pTVar17);
              if (!bVar12) {
                local_1e0._M_buckets = (__buckets_ptr)0x0;
                FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1a8);
                (*(this_00->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])(this_00);
                this_00 = (SimpleDescriptorDatabase *)local_1e0._M_buckets;
                break;
              }
            }
            FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1a8);
            iVar14 = iVar14 + 1;
          } while (iVar14 < local_b0);
        }
      }
      else {
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,(pbVar37->_M_dataplus)._M_p,
                             pbVar37->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,": close: ",9);
        piVar16 = __errno_location();
        pcVar19 = strerror(*piVar16);
        if (pcVar19 == (char *)0x0) {
          std::ios::clear((int)poVar18 + (int)*(undefined8 *)(*(long *)poVar18 + -0x18));
        }
        else {
          sVar20 = strlen(pcVar19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar19,sVar20);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
        std::ostream::put((char)poVar18);
        std::ostream::flush();
LAB_0022e300:
        local_1e0._M_buckets = (__buckets_ptr)0x0;
        this_00 = (SimpleDescriptorDatabase *)local_1e0._M_buckets;
      }
      local_1e0._M_buckets = (__buckets_ptr)this_00;
      FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_c8);
      if ((SimpleDescriptorDatabase *)local_1e0._M_buckets == (SimpleDescriptorDatabase *)0x0)
      goto LAB_0022e401;
      std::
      vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
      ::
      emplace_back<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>
                ((vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>,std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,std::default_delete<google::protobuf::SimpleDescriptorDatabase>>>>
                  *)&local_208,
                 (unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                  *)&local_1e0);
      if ((SimpleDescriptorDatabase *)local_1e0._M_buckets != (SimpleDescriptorDatabase *)0x0) {
        (*((DescriptorDatabase *)local_1e0._M_buckets)->_vptr_DescriptorDatabase[1])();
      }
      pbVar37 = pbVar37 + 1;
      if (pbVar37 == pbVar2) {
        local_1a8._0_8_ = (pointer)0x0;
        local_1a8._8_8_ = (DescriptorDatabase **)0x0;
        local_198[0]._M_allocated_capacity = (DescriptorDatabase **)0x0;
        std::
        vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
        ::reserve((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                   *)local_1a8,
                  (long)local_208.
                        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_208.
                        super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar7 = local_208.
                 super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_208.
            super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_208.
            super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          puVar32 = local_208.
                    super__Vector_base<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_c8._0_8_ =
                 (puVar32->_M_t).
                 super___uniq_ptr_impl<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>
                 .super__Head_base<0UL,_google::protobuf::SimpleDescriptorDatabase_*,_false>.
                 _M_head_impl;
            if (local_1a8._8_8_ == local_198[0]._M_allocated_capacity) {
              std::
              vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
              ::_M_realloc_insert<google::protobuf::DescriptorDatabase*>
                        ((vector<google::protobuf::DescriptorDatabase*,std::allocator<google::protobuf::DescriptorDatabase*>>
                          *)local_1a8,(iterator)local_1a8._8_8_,(DescriptorDatabase **)local_c8);
            }
            else {
              *(undefined8 *)local_1a8._8_8_ = local_c8._0_8_;
              local_1a8._8_8_ = local_1a8._8_8_ + 8;
            }
            puVar32 = puVar32 + 1;
          } while (puVar32 != puVar7);
        }
        this_01 = (MergedDescriptorDatabase *)operator_new(0x20);
        MergedDescriptorDatabase::MergedDescriptorDatabase
                  (this_01,(vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                            *)local_1a8);
        if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1a8._0_8_);
        }
        break;
      }
    } while( true );
  }
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar12 = VerifyInputFilesInDescriptors(this,&this_01->super_DescriptorDatabase);
    if (!bVar12) {
      local_240 = (DiskSourceTree *)0x0;
      goto LAB_0022e80f;
    }
    local_258 = (MultiFileErrorCollector *)operator_new(0x30);
    EVar1 = this->error_format_;
    local_258->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004cf2d0;
    local_258[1]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_004cf320;
    local_258[2]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004cf350;
    *(ErrorFormat *)&local_258[3]._vptr_MultiFileErrorCollector = EVar1;
    local_258[4]._vptr_MultiFileErrorCollector = (_func_int **)0x0;
    *(undefined2 *)&local_258[5]._vptr_MultiFileErrorCollector = 0;
    pDVar21 = (DescriptorPool *)operator_new(0x60);
    DescriptorPool::DescriptorPool
              (pDVar21,&this_01->super_DescriptorDatabase,(ErrorCollector *)(local_258 + 2));
    local_250 = (SourceTreeDescriptorDatabase *)0x0;
    local_240 = (DiskSourceTree *)0x0;
    source_tree = extraout_RDX_00;
LAB_0022e6b1:
    pDVar21->enforce_weak_ = true;
    local_230 = pDVar21;
    bVar12 = ParseInputFiles(this,pDVar21,source_tree,&local_228);
    iVar14 = 1;
    if (bVar12) {
      local_1e0._M_buckets = &local_1e0._M_single_bucket;
      local_1e0._M_bucket_count = 1;
      local_1e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1e0._M_element_count = 0;
      local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
      local_1e0._M_rehash_policy._M_next_resize = 0;
      local_1e0._M_single_bucket = (__node_base_ptr)0x0;
      if ((this->mode_ == MODE_COMPILE) &&
         (pOVar23 = (this->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (this->output_directives_).
         super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
         ._M_impl.super__Vector_impl_data._M_finish != pOVar23)) {
        lVar33 = 0;
        uVar36 = 0;
        do {
          local_1a8._0_8_ = local_1a8 + 0x10;
          lVar34 = *(long *)((long)&(pOVar23->output_location)._M_dataplus._M_p + lVar33);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,lVar34,
                     *(long *)((long)&(pOVar23->output_location)._M_string_length + lVar33) + lVar34
                    );
          uVar10 = local_1a8._8_8_;
          uVar8 = local_1a8._0_8_;
          if ((long)local_1a8._8_8_ < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (local_1a8._8_8_,"string length exceeds max size");
LAB_0022e887:
            uVar11 = local_1a8._8_8_;
            uVar9 = local_1a8._0_8_;
            if (*(int *)(uVar8 + uVar10 + -4) != 0x70697a2e) {
              if ((long)local_1a8._8_8_ < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          (local_1a8._8_8_,"string length exceeds max size");
LAB_0022e8b5:
                if (*(int *)(uVar9 + uVar11 + -4) == 0x72616a2e) goto LAB_0022e925;
              }
              else if ((DescriptorDatabase **)0x3 < (ulong)local_1a8._8_8_) goto LAB_0022e8b5;
              uVar10 = local_1a8._8_8_;
              uVar8 = local_1a8._0_8_;
              if ((long)local_1a8._8_8_ < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          (local_1a8._8_8_,"string length exceeds max size");
              }
              else if ((ulong)local_1a8._8_8_ < (DescriptorDatabase **)0x7) goto LAB_0022e903;
              if (*(int *)(uVar8 + uVar10 + -4) != 0x72616a63 ||
                  *(int *)(uVar8 + uVar10 + -7) != 0x6372732e) goto LAB_0022e903;
            }
          }
          else {
            if ((DescriptorDatabase **)0x3 < (ulong)local_1a8._8_8_) goto LAB_0022e887;
LAB_0022e903:
            if (((DescriptorDatabase **)local_1a8._8_8_ != (DescriptorDatabase **)0x0) &&
               (*(char *)(local_1a8._0_8_ + local_1a8._8_8_ + -1) != '/')) {
              std::__cxx11::string::push_back((char)(key_type *)local_1a8);
            }
          }
LAB_0022e925:
          pmVar24 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_1e0,(key_type *)local_1a8);
          pGVar25 = (pmVar24->_M_t).
                    super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                    .
                    super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                    ._M_head_impl;
          if (pGVar25 == (GeneratorContextImpl *)0x0) {
            pGVar25 = (GeneratorContextImpl *)operator_new(0x48);
            (pGVar25->super_GeneratorContext)._vptr_GeneratorContext =
                 (_func_int **)&PTR__GeneratorContextImpl_004cf200;
            p_Var6 = &(pGVar25->files_)._M_t._M_impl.super__Rb_tree_header;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var6->_M_header;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var6->_M_header;
            (pGVar25->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pGVar25->parsed_files_ = &local_228;
            pGVar25->had_error_ = false;
            pGVar3 = (pmVar24->_M_t).
                     super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                     ._M_head_impl;
            (pmVar24->_M_t).
            super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
            .
            super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
            ._M_head_impl = pGVar25;
            if (pGVar3 != (GeneratorContextImpl *)0x0) {
              (*(pGVar3->super_GeneratorContext)._vptr_GeneratorContext[1])();
              pGVar25 = (pmVar24->_M_t).
                        super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl_*,_false>
                        ._M_head_impl;
            }
          }
          bVar12 = GenerateOutput(this,&local_228,
                                  (OutputDirective *)
                                  ((long)&(((this->output_directives_).
                                            super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->name).
                                          _M_dataplus._M_p + lVar33),
                                  &pGVar25->super_GeneratorContext);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_);
          }
          iVar14 = 1;
          if (!bVar12) goto LAB_0022ed33;
          uVar36 = uVar36 + 1;
          pOVar23 = (this->output_directives_).
                    super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar29 = ((long)(this->output_directives_).
                          super__Vector_base<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar23 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          lVar33 = lVar33 + 0x68;
          _Var35._M_nxt = local_1e0._M_before_begin._M_nxt;
        } while (uVar36 <= uVar29 && uVar29 - uVar36 != 0);
        for (; _Var35._M_nxt != (_Hash_node_base *)0x0; _Var35._M_nxt = (_Var35._M_nxt)->_M_nxt) {
          local_1e8 = (string *)(_Var35._M_nxt + 1);
          pGVar25 = (GeneratorContextImpl *)_Var35._M_nxt[5]._M_nxt;
          p_Var4 = _Var35._M_nxt[1]._M_nxt;
          p_Var5 = _Var35._M_nxt[2]._M_nxt;
          if ((long)p_Var5 < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      ((size_t)p_Var5,"string length exceeds max size");
LAB_0022ea75:
            if (((undefined1 *)((long)&p_Var4[-1]._M_nxt + 7))[(long)p_Var5] != '/') {
              p_Var4 = _Var35._M_nxt[1]._M_nxt;
              p_Var5 = _Var35._M_nxt[2]._M_nxt;
              if ((long)p_Var5 < 0) {
                stringpiece_internal::StringPiece::LogFatalSizeTooBig
                          ((size_t)p_Var5,"string length exceeds max size");
              }
              else if (p_Var5 < (_Hash_node_base *)0x4) goto LAB_0022eab2;
              if (*(int *)((undefined1 *)((long)&p_Var4[-1]._M_nxt + 4) + (long)p_Var5) ==
                  0x72616a2e) {
                GeneratorContextImpl::AddJarManifest(pGVar25);
              }
              goto LAB_0022eab2;
            }
            bVar12 = GeneratorContextImpl::WriteAllToDisk(pGVar25,local_1e8);
          }
          else {
            if (p_Var5 != (_Hash_node_base *)0x0) goto LAB_0022ea75;
LAB_0022eab2:
            bVar12 = GeneratorContextImpl::WriteAllToZip(pGVar25,local_1e8);
          }
          if (bVar12 == false) goto LAB_0022ed33;
        }
      }
      if ((this->dependency_out_name_)._M_string_length != 0) {
        if (local_240 == (DiskSourceTree *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_1a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                     ,1099);
          pLVar22 = internal::LogMessage::operator<<
                              ((LogMessage *)local_1a8,"CHECK failed: disk_source_tree.get(): ");
          internal::LogFinisher::operator=((LogFinisher *)local_c8,pLVar22);
          internal::LogMessage::~LogMessage((LogMessage *)local_1a8);
        }
        bVar12 = GenerateDependencyManifestFile
                           (this,&local_228,(GeneratorContextMap *)&local_1e0,local_240);
        iVar14 = 1;
        if (bVar12) goto LAB_0022e79e;
        goto LAB_0022ed33;
      }
LAB_0022e79e:
      if ((this->descriptor_set_out_name_)._M_string_length != 0) {
        bVar12 = WriteDescriptorSet(this,&local_228);
        iVar14 = 1;
        if (!bVar12) goto LAB_0022ed33;
      }
      if (this->mode_ - MODE_ENCODE < 2) {
        if ((this->codec_type_)._M_string_length == 0) {
          DescriptorPool::DescriptorPool((DescriptorPool *)local_c8);
          FileDescriptorProto::FileDescriptorProto
                    ((FileDescriptorProto *)local_1a8,(Arena *)0x0,false);
          local_198[0]._M_allocated_capacity = local_198[0]._M_allocated_capacity | 1;
          puVar31 = (undefined8 *)(local_1a8._8_8_ & 0xfffffffffffffffc);
          if ((local_1a8._8_8_ & 1) != 0) {
            puVar31 = (undefined8 *)*puVar31;
          }
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (local_f8,"empty_message.proto",puVar31);
          pDVar26 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_1a8);
          *(byte *)(pDVar26->_has_bits_).has_bits_ = (byte)(pDVar26->_has_bits_).has_bits_[0] | 1;
          uVar36 = (pDVar26->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar31 = (undefined8 *)(uVar36 & 0xfffffffffffffffc);
          if ((uVar36 & 1) != 0) {
            puVar31 = (undefined8 *)*puVar31;
          }
          internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                    (&pDVar26->name_,"EmptyMessage",puVar31);
          pFVar27 = DescriptorPool::BuildFile
                              ((DescriptorPool *)local_c8,(FileDescriptorProto *)local_1a8);
          if (pFVar27 == (FileDescriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x45f);
            pLVar22 = internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: pool.BuildFile(file) != NULL: ");
            internal::LogFinisher::operator=(&local_231,pLVar22);
            internal::LogMessage::~LogMessage(&local_68);
          }
          std::__cxx11::string::operator=((string *)&this->codec_type_,"EmptyMessage");
          bVar12 = EncodeOrDecode(this,(DescriptorPool *)local_c8);
          FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1a8);
          DescriptorPool::~DescriptorPool((DescriptorPool *)local_c8);
          iVar14 = 1;
          if (bVar12) goto LAB_0022ec2e;
        }
        else {
          bVar12 = EncodeOrDecode(this,local_230);
          iVar14 = 1;
          if (bVar12) goto LAB_0022ec2e;
        }
      }
      else {
LAB_0022ec2e:
        iVar14 = 1;
        if ((*(char *)&local_258[5]._vptr_MultiFileErrorCollector == '\0') &&
           (((this->fatal_warnings_ != true ||
             (*(char *)((long)&local_258[5]._vptr_MultiFileErrorCollector + 1) == '\0')) &&
            (iVar14 = 0, this->mode_ == MODE_PRINT)))) {
          if (this->print_mode_ == PRINT_NONE) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_1a8,LOGLEVEL_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x47b);
            pLVar22 = internal::LogMessage::operator<<
                                ((LogMessage *)local_1a8,
                                 "If the code reaches here, it usually means a bug of flag parsing in the CommandLineInterface."
                                );
            internal::LogFinisher::operator=((LogFinisher *)local_c8,pLVar22);
            internal::LogMessage::~LogMessage((LogMessage *)local_1a8);
            iVar14 = 1;
          }
          else if ((this->print_mode_ == PRINT_FREE_FIELDS) &&
                  (local_228.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   local_228.
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)) {
            uVar36 = 0;
            iVar14 = 0;
            ppFVar28 = local_228.
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppFVar30 = local_228.
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            do {
              pFVar27 = ppFVar28[uVar36];
              if (0 < *(int *)(pFVar27 + 0x2c)) {
                lVar33 = 0;
                lVar34 = 0;
                do {
                  PrintFreeFieldNumbers(this,(Descriptor *)(*(long *)(pFVar27 + 0x58) + lVar33));
                  lVar34 = lVar34 + 1;
                  lVar33 = lVar33 + 0x88;
                  ppFVar28 = local_228.
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppFVar30 = local_228.
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                } while (lVar34 < *(int *)(pFVar27 + 0x2c));
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 < (ulong)((long)ppFVar30 - (long)ppFVar28 >> 3));
          }
        }
      }
LAB_0022ed33:
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl,_std::default_delete<google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_1e0);
    }
    if (local_250 != (SourceTreeDescriptorDatabase *)0x0) {
      (*(local_250->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])();
    }
  }
  else {
    local_240 = (DiskSourceTree *)operator_new(0x40);
    DiskSourceTree::DiskSourceTree(local_240);
    bVar12 = InitializeDiskSourceTree(this,local_240,&this_01->super_DescriptorDatabase);
    if (bVar12) {
      local_258 = (MultiFileErrorCollector *)operator_new(0x30);
      EVar1 = this->error_format_;
      local_258->_vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004cf2d0;
      local_258[1]._vptr_MultiFileErrorCollector = (_func_int **)&DAT_004cf320;
      local_258[2]._vptr_MultiFileErrorCollector = (_func_int **)&PTR__ErrorPrinter_004cf350;
      *(ErrorFormat *)&local_258[3]._vptr_MultiFileErrorCollector = EVar1;
      local_258[4]._vptr_MultiFileErrorCollector = (_func_int **)local_240;
      *(undefined2 *)&local_258[5]._vptr_MultiFileErrorCollector = 0;
      local_250 = (SourceTreeDescriptorDatabase *)operator_new(0x98);
      SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase
                (local_250,(SourceTree *)local_240,&this_01->super_DescriptorDatabase);
      local_250->error_collector_ = local_258;
      pDVar21 = (DescriptorPool *)operator_new(0x60);
      local_250->using_validation_error_collector_ = true;
      DescriptorPool::DescriptorPool
                (pDVar21,(DescriptorDatabase *)local_250,
                 &(local_250->validation_error_collector_).super_ErrorCollector);
      source_tree = extraout_RDX;
      goto LAB_0022e6b1;
    }
LAB_0022e80f:
    iVar14 = 1;
    local_258 = (MultiFileErrorCollector *)0x0;
  }
  if (this_01 != (MergedDescriptorDatabase *)0x0) {
    (*(this_01->super_DescriptorDatabase)._vptr_DescriptorDatabase[1])(this_01);
  }
LAB_0022ed69:
  std::
  vector<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>,_std::allocator<std::unique_ptr<google::protobuf::SimpleDescriptorDatabase,_std::default_delete<google::protobuf::SimpleDescriptorDatabase>_>_>_>
  ::~vector(&local_208);
  pDVar21 = local_230;
  if (local_230 != (DescriptorPool *)0x0) {
    DescriptorPool::~DescriptorPool(local_230);
    operator_delete(pDVar21);
  }
  if (local_258 != (MultiFileErrorCollector *)0x0) {
    (*local_258->_vptr_MultiFileErrorCollector[1])(local_258);
  }
  if (local_240 != (DiskSourceTree *)0x0) {
    (*(local_240->super_SourceTree)._vptr_SourceTree[1])(local_240);
  }
  if (local_228.
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar14;
code_r0x0022e131:
  piVar16 = __errno_location();
  if (*piVar16 != 4) goto LAB_0022e36d;
  goto LAB_0022e11f;
LAB_0022e36d:
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(pbVar37->_M_dataplus)._M_p,pbVar37->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,": ",2);
  pcVar19 = strerror(2);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear((int)poVar18 + (int)*(undefined8 *)(*(long *)poVar18 + -0x18));
  }
  else {
    sVar20 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar19,sVar20);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
LAB_0022e401:
  iVar14 = 1;
  local_258 = (MultiFileErrorCollector *)0x0;
  local_240 = (DiskSourceTree *)0x0;
  goto LAB_0022ed69;
}

Assistant:

int CommandLineInterface::Run(int argc, const char* const argv[]) {
  Clear();
  switch (ParseArguments(argc, argv)) {
    case PARSE_ARGUMENT_DONE_AND_EXIT:
      return 0;
    case PARSE_ARGUMENT_FAIL:
      return 1;
    case PARSE_ARGUMENT_DONE_AND_CONTINUE:
      break;
  }

  std::vector<const FileDescriptor*> parsed_files;
  std::unique_ptr<DiskSourceTree> disk_source_tree;
  std::unique_ptr<ErrorPrinter> error_collector;
  std::unique_ptr<DescriptorPool> descriptor_pool;

  // The SimpleDescriptorDatabases here are the constituents of the
  // MergedDescriptorDatabase descriptor_set_in_database, so this vector is for
  // managing their lifetimes. Its scope should match descriptor_set_in_database
  std::vector<std::unique_ptr<SimpleDescriptorDatabase>>
      databases_per_descriptor_set;
  std::unique_ptr<MergedDescriptorDatabase> descriptor_set_in_database;

  std::unique_ptr<SourceTreeDescriptorDatabase> source_tree_database;

  // Any --descriptor_set_in FileDescriptorSet objects will be used as a
  // fallback to input_files on command line, so create that db first.
  if (!descriptor_set_in_names_.empty()) {
    for (const std::string& name : descriptor_set_in_names_) {
      std::unique_ptr<SimpleDescriptorDatabase> database_for_descriptor_set =
          PopulateSingleSimpleDescriptorDatabase(name);
      if (!database_for_descriptor_set) {
        return EXIT_FAILURE;
      }
      databases_per_descriptor_set.push_back(
          std::move(database_for_descriptor_set));
    }

    std::vector<DescriptorDatabase*> raw_databases_per_descriptor_set;
    raw_databases_per_descriptor_set.reserve(
        databases_per_descriptor_set.size());
    for (const std::unique_ptr<SimpleDescriptorDatabase>& db :
         databases_per_descriptor_set) {
      raw_databases_per_descriptor_set.push_back(db.get());
    }
    descriptor_set_in_database.reset(
        new MergedDescriptorDatabase(raw_databases_per_descriptor_set));
  }

  if (proto_path_.empty()) {
    // If there are no --proto_path flags, then just look in the specified
    // --descriptor_set_in files.  But first, verify that the input files are
    // there.
    if (!VerifyInputFilesInDescriptors(descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(new ErrorPrinter(error_format_));
    descriptor_pool.reset(new DescriptorPool(descriptor_set_in_database.get(),
                                             error_collector.get()));
  } else {
    disk_source_tree.reset(new DiskSourceTree());
    if (!InitializeDiskSourceTree(disk_source_tree.get(),
                                  descriptor_set_in_database.get())) {
      return 1;
    }

    error_collector.reset(
        new ErrorPrinter(error_format_, disk_source_tree.get()));

    source_tree_database.reset(new SourceTreeDescriptorDatabase(
        disk_source_tree.get(), descriptor_set_in_database.get()));
    source_tree_database->RecordErrorsTo(error_collector.get());

    descriptor_pool.reset(new DescriptorPool(
        source_tree_database.get(),
        source_tree_database->GetValidationErrorCollector()));
  }

  descriptor_pool->EnforceWeakDependencies(true);
  if (!ParseInputFiles(descriptor_pool.get(), disk_source_tree.get(),
                       &parsed_files)) {
    return 1;
  }


  // We construct a separate GeneratorContext for each output location.  Note
  // that two code generators may output to the same location, in which case
  // they should share a single GeneratorContext so that OpenForInsert() works.
  GeneratorContextMap output_directories;

  // Generate output.
  if (mode_ == MODE_COMPILE) {
    for (int i = 0; i < output_directives_.size(); i++) {
      std::string output_location = output_directives_[i].output_location;
      if (!HasSuffixString(output_location, ".zip") &&
          !HasSuffixString(output_location, ".jar") &&
          !HasSuffixString(output_location, ".srcjar")) {
        AddTrailingSlash(&output_location);
      }

      auto& generator = output_directories[output_location];

      if (!generator) {
        // First time we've seen this output location.
        generator.reset(new GeneratorContextImpl(parsed_files));
      }

      if (!GenerateOutput(parsed_files, output_directives_[i],
                          generator.get())) {
        return 1;
      }
    }
  }

  // Write all output to disk.
  for (const auto& pair : output_directories) {
    const std::string& location = pair.first;
    GeneratorContextImpl* directory = pair.second.get();
    if (HasSuffixString(location, "/")) {
      if (!directory->WriteAllToDisk(location)) {
        return 1;
      }
    } else {
      if (HasSuffixString(location, ".jar")) {
        directory->AddJarManifest();
      }

      if (!directory->WriteAllToZip(location)) {
        return 1;
      }
    }
  }

  if (!dependency_out_name_.empty()) {
    GOOGLE_DCHECK(disk_source_tree.get());
    if (!GenerateDependencyManifestFile(parsed_files, output_directories,
                                        disk_source_tree.get())) {
      return 1;
    }
  }

  if (!descriptor_set_out_name_.empty()) {
    if (!WriteDescriptorSet(parsed_files)) {
      return 1;
    }
  }

  if (mode_ == MODE_ENCODE || mode_ == MODE_DECODE) {
    if (codec_type_.empty()) {
      // HACK:  Define an EmptyMessage type to use for decoding.
      DescriptorPool pool;
      FileDescriptorProto file;
      file.set_name("empty_message.proto");
      file.add_message_type()->set_name("EmptyMessage");
      GOOGLE_CHECK(pool.BuildFile(file) != NULL);
      codec_type_ = "EmptyMessage";
      if (!EncodeOrDecode(&pool)) {
        return 1;
      }
    } else {
      if (!EncodeOrDecode(descriptor_pool.get())) {
        return 1;
      }
    }
  }

  if (error_collector->FoundErrors() ||
      (fatal_warnings_ && error_collector->FoundWarnings())) {
    return 1;
  }

  if (mode_ == MODE_PRINT) {
    switch (print_mode_) {
      case PRINT_FREE_FIELDS:
        for (int i = 0; i < parsed_files.size(); ++i) {
          const FileDescriptor* fd = parsed_files[i];
          for (int j = 0; j < fd->message_type_count(); ++j) {
            PrintFreeFieldNumbers(fd->message_type(j));
          }
        }
        break;
      case PRINT_NONE:
        GOOGLE_LOG(ERROR) << "If the code reaches here, it usually means a bug of "
                      "flag parsing in the CommandLineInterface.";
        return 1;

        // Do not add a default case.
    }
  }

  return 0;
}